

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_arg.cxx
# Opt level: O2

int Fl::arg(int argc,char **argv,int *i)

{
  char *s;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  int v;
  char *pcVar7;
  uint gh;
  uint gw;
  int gy;
  int gx;
  
  arg_called = 1;
  iVar5 = *i;
  pcVar7 = argv[iVar5];
  if (pcVar7 == (char *)0x0) {
    *i = iVar5 + 1;
    return 1;
  }
  if (((*pcVar7 != '-') || (pcVar7[1] == '-')) || (pcVar7[1] == '\0')) {
    arg_called = 1;
    return_i = 1;
    return 0;
  }
  pcVar7 = pcVar7 + 1;
  iVar4 = fl_match(pcVar7,"iconic",1);
  if (iVar4 != 0) {
    fl_show_iconic = '\x01';
    goto LAB_001d9788;
  }
  v = 1;
  iVar4 = fl_match(pcVar7,"kbd",1);
  if (iVar4 == 0) {
    iVar4 = fl_match(pcVar7,"nokbd",3);
    if (iVar4 == 0) {
      iVar4 = fl_match(pcVar7,"dnd",2);
      if (iVar4 == 0) {
        iVar4 = fl_match(pcVar7,"nodnd",3);
        if (iVar4 == 0) {
          iVar4 = fl_match(pcVar7,"tooltips",2);
          if (iVar4 == 0) {
            iVar4 = fl_match(pcVar7,"notooltips",3);
            if (iVar4 == 0) {
              s = argv[(long)iVar5 + 1];
              if (s == (char *)0x0 || argc + -1 <= iVar5) {
                return 0;
              }
              iVar5 = fl_match(pcVar7,"geometry",1);
              if (iVar5 == 0) {
                iVar5 = fl_match(pcVar7,"display",2);
                if (iVar5 == 0) {
                  iVar5 = fl_match(pcVar7,"title",2);
                  pcVar1 = geometry;
                  pcVar2 = s;
                  pcVar3 = ::name;
                  if ((iVar5 == 0) &&
                     (iVar5 = fl_match(pcVar7,"name",2), pcVar1 = geometry, pcVar2 = title,
                     pcVar3 = s, iVar5 == 0)) {
                    iVar5 = fl_match(pcVar7,"bg2",3);
                    if ((iVar5 == 0) && (iVar5 = fl_match(pcVar7,"background2",0xb), iVar5 == 0)) {
                      iVar5 = fl_match(pcVar7,"bg",2);
                      if ((iVar5 == 0) && (iVar5 = fl_match(pcVar7,"background",10), iVar5 == 0)) {
                        iVar5 = fl_match(pcVar7,"fg",2);
                        if ((iVar5 == 0) && (iVar5 = fl_match(pcVar7,"foreground",10), iVar5 == 0))
                        {
                          iVar5 = fl_match(pcVar7,"scheme",1);
                          if (iVar5 == 0) {
                            return 0;
                          }
                          scheme(s);
                          pcVar1 = geometry;
                          pcVar2 = title;
                          pcVar3 = ::name;
                          goto LAB_001d9914;
                        }
                        ppcVar6 = &fl_fg;
                      }
                      else {
                        ppcVar6 = &fl_bg;
                      }
                    }
                    else {
                      ppcVar6 = &fl_bg2;
                    }
                    *ppcVar6 = s;
                    pcVar1 = geometry;
                    pcVar2 = title;
                    pcVar3 = ::name;
                  }
                }
                else {
                  display(s);
                  pcVar1 = geometry;
                  pcVar2 = title;
                  pcVar3 = ::name;
                }
              }
              else {
                iVar5 = XParseGeometry(s,&gx,&gy,&gw,&gh);
                pcVar1 = s;
                pcVar2 = title;
                pcVar3 = ::name;
                if (iVar5 == 0) {
                  return 0;
                }
              }
LAB_001d9914:
              ::name = pcVar3;
              title = pcVar2;
              geometry = pcVar1;
              *i = *i + 2;
              return 2;
            }
            Fl_Tooltip::disable();
          }
          else {
            Fl_Tooltip::enable(1);
          }
          goto LAB_001d9788;
        }
        iVar5 = 0;
      }
      else {
        iVar5 = 1;
      }
      dnd_text_ops(iVar5);
      goto LAB_001d9788;
    }
    v = 0;
  }
  visible_focus(v);
LAB_001d9788:
  *i = *i + 1;
  return 1;
}

Assistant:

int Fl::arg(int argc, char **argv, int &i) {
  arg_called = 1;
  const char *s = argv[i];

  if (!s) {i++; return 1;}	// something removed by calling program?

  // a word that does not start with '-', or a word after a '--', or
  // the word '-' by itself all start the "non-switch arguments" to
  // a program.  Return 0 to indicate that we don't understand the
  // word, but set a flag (return_i) so that args() will return at
  // that point:
  if (s[0] != '-' || s[1] == '-' || !s[1]) {return_i = 1; return 0;}
  s++; // point after the dash

  if (fl_match(s, "iconic")) {
    fl_show_iconic = 1;
    i++;
    return 1;
  } else if (fl_match(s, "kbd")) {
    Fl::visible_focus(1);
    i++;
    return 1;
  } else if (fl_match(s, "nokbd", 3)) {
    Fl::visible_focus(0);
    i++;
    return 1;
  } else if (fl_match(s, "dnd", 2)) {
    Fl::dnd_text_ops(1);
    i++;
    return 1;
  } else if (fl_match(s, "nodnd", 3)) {
    Fl::dnd_text_ops(0);
    i++;
    return 1;
  } else if (fl_match(s, "tooltips", 2)) {
    Fl_Tooltip::enable();
    i++;
    return 1;
  } else if (fl_match(s, "notooltips", 3)) {
    Fl_Tooltip::disable();
    i++;
    return 1;
  }
#ifdef __APPLE__
  // The Finder application in MacOS X passes the "-psn_N_NNNNN" option
  // to all apps...
  else if (strcmp(s, "NSDocumentRevisionsDebugMode") == 0) {
    i++;
    if (argv[i]) i++;
    return 1;
  } else if (strncmp(s, "psn_", 4) == 0) {
    i++;
    return 1;
  }
#endif // __APPLE__

  const char *v = argv[i+1];
  if (i >= argc-1 || !v)
    return 0;	// all the rest need an argument, so if missing it is an error

  if (fl_match(s, "geometry")) {

    int flags, gx, gy; unsigned int gw, gh;
    flags = XParseGeometry(v, &gx, &gy, &gw, &gh);
    if (!flags) return 0;
    geometry = v;

#if !defined(WIN32) && !defined(__APPLE__)
  } else if (fl_match(s, "display", 2)) {
    Fl::display(v);
#endif

  } else if (fl_match(s, "title", 2)) {
    title = v;

  } else if (fl_match(s, "name", 2)) {
    name = v;

  } else if (fl_match(s, "bg2", 3) || fl_match(s, "background2", 11)) {
    fl_bg2 = v;

  } else if (fl_match(s, "bg", 2) || fl_match(s, "background", 10)) {
    fl_bg = v;

  } else if (fl_match(s, "fg", 2) || fl_match(s, "foreground", 10)) {
    fl_fg = v;

  } else if (fl_match(s, "scheme", 1)) {
    Fl::scheme(v);

  } else return 0; // unrecognized

  i += 2;
  return 2;
}